

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O3

sFace * __thiscall gjkepa2_impl::EPA::newface(EPA *this,sSV *a,sSV *b,sSV *c,bool forced)

{
  cbtScalar *dist;
  U *pUVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  sFace *face;
  sFace *psVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  _ _Var13;
  float fVar14;
  undefined1 auVar15 [16];
  
  face = (this->m_stock).root;
  if (face == (sFace *)0x0) {
    this->m_status = OutOfFaces;
  }
  else {
    psVar5 = face->l[0];
    if (face->l[1] != (sFace *)0x0) {
      face->l[1]->l[0] = psVar5;
    }
    if (psVar5 != (sFace *)0x0) {
      psVar5->l[1] = face->l[1];
    }
    if ((this->m_stock).root == face) {
      (this->m_stock).root = face->l[1];
    }
    pUVar1 = &(this->m_stock).count;
    *pUVar1 = *pUVar1 - 1;
    face->l[0] = (sFace *)0x0;
    psVar5 = (this->m_hull).root;
    face->l[1] = psVar5;
    if (psVar5 != (sFace *)0x0) {
      psVar5->l[0] = face;
    }
    (this->m_hull).root = face;
    pUVar1 = &(this->m_hull).count;
    *pUVar1 = *pUVar1 + 1;
    face->pass = '\0';
    face->c[0] = a;
    face->c[1] = b;
    face->c[2] = c;
    _Var13 = Degenerated;
    fVar14 = (a->w).m_floats[0];
    fVar2 = (a->w).m_floats[1];
    fVar3 = (a->w).m_floats[2];
    fVar6 = (b->w).m_floats[0] - fVar14;
    fVar14 = (c->w).m_floats[0] - fVar14;
    fVar7 = (b->w).m_floats[1] - fVar2;
    fVar8 = (b->w).m_floats[2] - fVar3;
    fVar2 = (c->w).m_floats[1] - fVar2;
    fVar3 = (c->w).m_floats[2] - fVar3;
    auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar8)),ZEXT416((uint)fVar7),
                             ZEXT416((uint)fVar3));
    auVar10 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * fVar6)),ZEXT416((uint)fVar14),
                              ZEXT416((uint)fVar8));
    auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar14 * fVar7)),ZEXT416((uint)fVar6),
                              ZEXT416((uint)fVar2));
    auVar15 = vinsertps_avx(auVar9,auVar10,0x10);
    auVar15 = vinsertps_avx(auVar15,auVar11,0x28);
    *(undefined1 (*) [16])(face->n).m_floats = auVar15;
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar10._0_4_)),auVar9,auVar9);
    auVar15 = vfmadd231ss_fma(auVar15,auVar11,auVar11);
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    fVar14 = auVar15._0_4_;
    if (0.0001 < fVar14) {
      dist = &face->d;
      bVar12 = getedgedist(this,face,a,b,dist);
      if (((!bVar12) && (bVar12 = getedgedist(this,face,b,c,dist), !bVar12)) &&
         (bVar12 = getedgedist(this,face,c,a,dist), !bVar12)) {
        auVar15 = vfmadd231ss_fma(ZEXT416((uint)((a->w).m_floats[1] * (face->n).m_floats[1])),
                                  ZEXT416((uint)(a->w).m_floats[0]),
                                  ZEXT416((uint)(face->n).m_floats[0]));
        auVar15 = vfmadd132ss_fma(ZEXT416((uint)(a->w).m_floats[2]),auVar15,
                                  ZEXT416((uint)(face->n).m_floats[2]));
        face->d = auVar15._0_4_ / fVar14;
      }
      uVar4 = *(undefined8 *)(face->n).m_floats;
      fVar14 = 1.0 / fVar14;
      auVar15._0_4_ = fVar14 * (float)uVar4;
      auVar15._4_4_ = fVar14 * (float)((ulong)uVar4 >> 0x20);
      auVar15._8_4_ = fVar14 * 0.0;
      auVar15._12_4_ = fVar14 * 0.0;
      uVar4 = vmovlps_avx(auVar15);
      *(undefined8 *)(face->n).m_floats = uVar4;
      (face->n).m_floats[2] = fVar14 * (face->n).m_floats[2];
      if (forced) {
        return face;
      }
      _Var13 = NonConvex;
      if (-1e-05 <= *dist) {
        return face;
      }
    }
    this->m_status = _Var13;
    psVar5 = face->l[0];
    if (face->l[1] != (sFace *)0x0) {
      face->l[1]->l[0] = psVar5;
    }
    if (psVar5 != (sFace *)0x0) {
      psVar5->l[1] = face->l[1];
    }
    if ((this->m_hull).root == face) {
      (this->m_hull).root = face->l[1];
    }
    pUVar1 = &(this->m_hull).count;
    *pUVar1 = *pUVar1 - 1;
    face->l[0] = (sFace *)0x0;
    psVar5 = (this->m_stock).root;
    face->l[1] = psVar5;
    if (psVar5 != (sFace *)0x0) {
      psVar5->l[0] = face;
    }
    (this->m_stock).root = face;
    pUVar1 = &(this->m_stock).count;
    *pUVar1 = *pUVar1 + 1;
  }
  return (sFace *)0x0;
}

Assistant:

sFace* newface(sSV* a, sSV* b, sSV* c, bool forced)
	{
		if (m_stock.root)
		{
			sFace* face = m_stock.root;
			remove(m_stock, face);
			append(m_hull, face);
			face->pass = 0;
			face->c[0] = a;
			face->c[1] = b;
			face->c[2] = c;
			face->n = cbtCross(b->w - a->w, c->w - a->w);
			const cbtScalar l = face->n.length();
			const bool v = l > EPA_ACCURACY;

			if (v)
			{
				if (!(getedgedist(face, a, b, face->d) ||
					  getedgedist(face, b, c, face->d) ||
					  getedgedist(face, c, a, face->d)))
				{
					// Origin projects to the interior of the triangle
					// Use distance to triangle plane
					face->d = cbtDot(a->w, face->n) / l;
				}

				face->n /= l;
				if (forced || (face->d >= -EPA_PLANE_EPS))
				{
					return face;
				}
				else
					m_status = eStatus::NonConvex;
			}
			else
				m_status = eStatus::Degenerated;

			remove(m_hull, face);
			append(m_stock, face);
			return 0;
		}
		m_status = m_stock.root ? eStatus::OutOfVertices : eStatus::OutOfFaces;
		return 0;
	}